

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnAtomicStoreExpr
          (BinaryReaderIR *this,Opcode opcode,Address alignment_log2,Address offset)

{
  int local_3c;
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)3>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>_>_>
  local_38;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_30;
  Address local_28;
  Address offset_local;
  Address alignment_log2_local;
  BinaryReaderIR *this_local;
  Opcode opcode_local;
  
  local_3c = 1 << ((byte)alignment_log2 & 0x1f);
  local_28 = offset;
  offset_local = alignment_log2;
  alignment_log2_local = (Address)this;
  this_local._0_4_ = opcode.enum_;
  MakeUnique<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Opcode&,int,unsigned_long&>
            ((wabt *)&local_38,(Opcode *)&this_local,&local_3c,&local_28);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)3>,std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_30,&local_38);
  this_local._4_4_ = AppendExpr(this,&local_30);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_30);
  std::
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)3>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)3>_>_>
  ::~unique_ptr(&local_38);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnAtomicStoreExpr(Opcode opcode,
                                         Address alignment_log2,
                                         Address offset) {
  return AppendExpr(
      MakeUnique<AtomicStoreExpr>(opcode, 1 << alignment_log2, offset));
}